

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_many_64(void **param_1)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  reference puVar2;
  Roaring64Map *this_00;
  iterator this_01;
  reference puVar3;
  unsigned_long value_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  Roaring64Map r2;
  Roaring64Map r1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  uint64_t b555;
  uint64_t b1;
  uint value;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Roaring64Map r2_1;
  Roaring64Map r1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values_1;
  undefined4 in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  Roaring64Map *in_stack_fffffffffffffdd0;
  Roaring64Map *this_02;
  char *in_stack_fffffffffffffdd8;
  char *expression;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffdf8;
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe00;
  iterator puVar4;
  Roaring64Map *in_stack_fffffffffffffe10;
  Roaring64Map *in_stack_fffffffffffffe18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe20;
  char local_198 [64];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined1 local_118 [56];
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  allocator_type local_98 [79];
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_38 = 0x270f00000000;
  local_48 = 0x7b0000270f;
  uStack_40 = 0xfffffff7ffffffff;
  local_30 = &local_48;
  local_28 = 6;
  puVar4 = (iterator)&local_49;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10a58e);
  __l._M_len = (size_type)in_stack_fffffffffffffe10;
  __l._M_array = (iterator)puVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffe00,__l,in_stack_fffffffffffffdf8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10a5bf);
  __a = local_98;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffdd0);
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10a5f2);
  roaring::Roaring64Map::addMany
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,(uint32_t *)0x10a604);
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffdd0);
  local_d8 = &local_20;
  local_e0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_118._48_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_e0);
    local_118._44_4_ = *puVar2;
    roaring::Roaring64Map::add(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_e0);
  }
  roaring::Roaring64Map::operator==(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  _assert_true((unsigned_long)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (char *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10a74e);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10a75b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffde0);
  local_118._32_8_ = (_Base_ptr)0x100000000;
  local_118._24_8_ = (_Base_ptr)0x22b00000000;
  local_158 = 0x22b0000270f;
  local_150 = 0x10000007b;
  local_148 = 0x1ffffffff;
  local_140 = 0x22bfffffff7;
  local_138 = 0;
  local_130 = 0x22b0000270f;
  local_128 = &local_158;
  local_120 = 6;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10a836);
  __l_00._M_len = (size_type)in_stack_fffffffffffffe10;
  __l_00._M_array = puVar4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this,__l_00,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10a867);
  expression = local_198;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffdd0);
  this_02 = (Roaring64Map *)local_118;
  this_00 = (Roaring64Map *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10a89a);
  roaring::Roaring64Map::addMany
            ((Roaring64Map *)in_stack_fffffffffffffe20._M_current,(size_t)in_stack_fffffffffffffe18,
             (uint64_t *)in_stack_fffffffffffffe10);
  roaring::Roaring64Map::Roaring64Map(this_02);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  this_01 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)this_02,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&stack0xfffffffffffffe20);
    in_stack_fffffffffffffe10 = (Roaring64Map *)*puVar3;
    roaring::Roaring64Map::add(this_00,(uint64_t)expression);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&stack0xfffffffffffffe20);
  }
  roaring::Roaring64Map::operator==((Roaring64Map *)this_01._M_current,in_stack_fffffffffffffe10);
  _assert_true((unsigned_long)this_00,expression,(char *)this_02,in_stack_fffffffffffffdcc);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10a9e2);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10a9ef);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_many_64) {
    {
        // 32-bit integers
        std::vector<uint32_t> values = {9999,       123, 0xFFFFFFFF,
                                        0xFFFFFFF7, 0,   9999};
        Roaring64Map r1;
        r1.addMany(values.size(), values.data());
        Roaring64Map r2;
        for (const auto value : values) {
            r2.add(value);
        }
        assert_true(r1 == r2);
    }

    auto b1 = uint64_t(1) << 32;
    auto b555 = uint64_t(555) << 32;

    std::vector<uint64_t> values = {
        b555 + 9999,       b1 + 123, b1 + 0xFFFFFFFF,
        b555 + 0xFFFFFFF7, 0,        b555 + 9999};
    Roaring64Map r1;
    r1.addMany(values.size(), values.data());
    Roaring64Map r2;
    for (const auto value : values) {
        r2.add(value);
    }
    assert_true(r1 == r2);
}